

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# package.cpp
# Opt level: O0

void makeFullFilenameAndDirs(char *path,char *name,char *filename,int32_t capacity)

{
  UBool UVar1;
  char *pcVar2;
  size_t sVar3;
  UErrorCode local_34;
  char *pcStack_30;
  UErrorCode errorCode;
  char *sep;
  char *pcStack_20;
  int32_t capacity_local;
  char *filename_local;
  char *name_local;
  char *path_local;
  
  sep._4_4_ = capacity;
  pcStack_20 = filename;
  filename_local = name;
  name_local = path;
  makeFullFilename(path,name,filename,capacity);
  local_34 = U_ZERO_ERROR;
  pcVar2 = strchr(pcStack_20,0);
  sVar3 = strlen(filename_local);
  pcStack_30 = pcVar2 + -sVar3;
  do {
    pcStack_30 = strchr(pcStack_30,0x2f);
    if (pcStack_30 == (char *)0x0) {
      return;
    }
    if (pcStack_30 != pcStack_20) {
      *pcStack_30 = '\0';
      uprv_mkdir(pcStack_20,&local_34);
      UVar1 = U_FAILURE(local_34);
      if (UVar1 != '\0') {
        fprintf(_stderr,"icupkg: unable to create tree directory \"%s\"\n",pcStack_20);
        exit(4);
      }
    }
    *pcStack_30 = '/';
    pcStack_30 = pcStack_30 + 1;
  } while( true );
}

Assistant:

static void
makeFullFilenameAndDirs(const char *path, const char *name,
                        char *filename, int32_t capacity) {
    char *sep;
    UErrorCode errorCode;

    makeFullFilename(path, name, filename, capacity);

    // make tree directories
    errorCode=U_ZERO_ERROR;
    sep=strchr(filename, 0)-strlen(name);
    while((sep=strchr(sep, U_FILE_SEP_CHAR))!=NULL) {
        if(sep!=filename) {
            *sep=0;                 // truncate temporarily
            uprv_mkdir(filename, &errorCode);
            if(U_FAILURE(errorCode)) {
                fprintf(stderr, "icupkg: unable to create tree directory \"%s\"\n", filename);
                exit(U_FILE_ACCESS_ERROR);
            }
        }
        *sep++=U_FILE_SEP_CHAR; // restore file separator character
    }
}